

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O2

void __thiscall
AlphaVectorWeighted::AlphaVectorWeighted
          (AlphaVectorWeighted *this,PlanningUnitDecPOMDPDiscrete *pu,
          vector<double,_std::allocator<double>_> *weights)

{
  undefined1 *this_00;
  _func_int *p_Var1;
  size_t sVar2;
  reference pvVar3;
  E *this_01;
  uint uVar4;
  ulong __n;
  PlanningUnitMADPDiscrete *this_02;
  
  AlphaVectorPlanning::AlphaVectorPlanning
            ((AlphaVectorPlanning *)&(this->super_AlphaVectorPOMDP).field_0x58,pu);
  AlphaVectorPOMDP::AlphaVectorPOMDP
            (&this->super_AlphaVectorPOMDP,&PTR_construction_vtable_24__005e2de8,pu);
  AlphaVectorBG::AlphaVectorBG
            ((AlphaVectorBG *)&(this->super_AlphaVectorPOMDP).field_0x8,
             &PTR_construction_vtable_24__005e2df8,pu);
  this_00 = &(this->super_AlphaVectorPOMDP).field_0x28;
  (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP =
       (_func_int **)&PTR__AlphaVectorWeighted_005e2d80;
  *(undefined ***)&(this->super_AlphaVectorPOMDP).field_0x58 = &PTR__AlphaVectorWeighted_005e2dd0;
  *(undefined ***)&(this->super_AlphaVectorPOMDP).field_0x8 = &PTR__AlphaVectorWeighted_005e2da8;
  (this->super_AlphaVectorPOMDP).field_0x20 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_00,weights);
  *(undefined8 *)&(this->super_AlphaVectorPOMDP).field_0x50 = 0;
  uVar4 = 0;
  *(undefined8 *)&(this->super_AlphaVectorPOMDP).field_0x40 = 0;
  *(undefined8 *)&(this->super_AlphaVectorPOMDP).field_0x48 = 0;
  do {
    p_Var1 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
    this_02 = *(PlanningUnitMADPDiscrete **)
               (&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var1);
    if (this_02 == (PlanningUnitMADPDiscrete *)0x0) {
      this_02 = *(PlanningUnitMADPDiscrete **)
                 (&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var1);
    }
    sVar2 = PlanningUnitMADPDiscrete::GetNrStates(this_02);
    __n = (ulong)uVar4;
    if (sVar2 == __n) {
      BackProjectWeights(this);
      return;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)this_00,__n);
    if (*pvVar3 < 0.0) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)this_00,__n);
    uVar4 = uVar4 + 1;
  } while (*pvVar3 <= 1.0);
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01,"AlphaVectorWeighted ctor: weights should be >=0 and <=1");
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

AlphaVectorWeighted::
AlphaVectorWeighted(const PlanningUnitDecPOMDPDiscrete* pu,
                    std::vector<double> weights) :
    AlphaVectorPlanning(pu),
    AlphaVectorPOMDP(pu),
    AlphaVectorBG(pu),
    _m_initialized(false),
    _m_weights(weights)
{
    for(Index s=0;s!=GetPU()->GetNrStates();++s)
        if(_m_weights.at(s) < 0 || _m_weights.at(s) > 1)
            throw(E("AlphaVectorWeighted ctor: weights should be >=0 and <=1"));
    BackProjectWeights();
}